

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O1

int stb_vorbis_seek_start(stb_vorbis *f)

{
  int iVar1;
  
  if (f->push_mode != '\0') {
    f->error = VORBIS_invalid_api_mixing;
    return 0;
  }
  set_file_offset(f,f->first_audio_page_offset);
  f->previous_length = 0;
  f->first_decode = '\x01';
  f->next_seg = -1;
  iVar1 = vorbis_pump_first_frame(f);
  return iVar1;
}

Assistant:

int stb_vorbis_seek_start(stb_vorbis *f)
{
   if (IS_PUSH_MODE(f)) { return error(f, VORBIS_invalid_api_mixing); }
   set_file_offset(f, f->first_audio_page_offset);
   f->previous_length = 0;
   f->first_decode = TRUE;
   f->next_seg = -1;
   return vorbis_pump_first_frame(f);
}